

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool __thiscall ON_SubDEdge::HasBoundaryEdgeTopology(ON_SubDEdge *this)

{
  ulong uVar1;
  ON_SubDEdgePtr OVar2;
  char *sFormat;
  int line_number;
  ON_SubDFace *this_00;
  
  if (this->m_face_count == 1) {
    uVar1 = this->m_face2[0].m_ptr;
    this_00 = (ON_SubDFace *)(uVar1 & 0xfffffffffffffff8);
    if (this_00 != (ON_SubDFace *)0x0) {
      OVar2 = ON_SubDFace::EdgePtrFromEdge(this_00,this);
      if ((ON_SubDEdge *)(OVar2.m_ptr & 0xfffffffffffffff8) == this) {
        if ((((uint)OVar2.m_ptr ^ (uint)uVar1) & 1) == 0) {
          if ((this->m_vertex[0] != (ON_SubDVertex *)0x0) &&
             (this->m_vertex[1] != (ON_SubDVertex *)0x0 && this->m_vertex[0] != this->m_vertex[1]))
          {
            return true;
          }
          ON_SubDIncrementErrorCount();
          sFormat = "m_vertex[] has null or invalid pointers.";
          line_number = 0x19ad;
        }
        else {
          ON_SubDIncrementErrorCount();
          sFormat = "m_face2[0] has inconsistent direction flags.";
          line_number = 0x19a8;
        }
      }
      else {
        ON_SubDIncrementErrorCount();
        sFormat = "m_face2[0] does not reference this edge.";
        line_number = 0x19a3;
      }
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                 ,line_number,"",sFormat);
      return false;
    }
  }
  return false;
}

Assistant:

bool ON_SubDEdge::HasBoundaryEdgeTopology() const
{
  for (;;)
  {
    if (1 != m_face_count)
      break;
    const ON_SubDFace* f = ON_SUBD_FACE_POINTER(m_face2[0].m_ptr);
    if (nullptr == f)
      break;
    const ON_SubDEdgePtr feptr = f->EdgePtrFromEdge(this);
    if (this != ON_SUBD_EDGE_POINTER(feptr.m_ptr))
    {
      ON_SUBD_ERROR("m_face2[0] does not reference this edge.");
      break;
    }
    if (ON_SUBD_FACE_DIRECTION(m_face2[0].m_ptr) != ON_SUBD_FACE_DIRECTION(feptr.m_ptr))
    {
      ON_SUBD_ERROR("m_face2[0] has inconsistent direction flags.");
      break;
    }
    if (nullptr == m_vertex[0] || nullptr == m_vertex[1] || m_vertex[0] == m_vertex[1])
    {
      ON_SUBD_ERROR("m_vertex[] has null or invalid pointers.");
      break;
    }
    return true;
  }
  return false;
}